

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_Logistic_Test::TestBody(Sampling_Logistic_Test *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float *pfVar11;
  size_t sVar12;
  bool bVar13;
  uint uVar14;
  Allocator AVar15;
  byte bVar16;
  int iVar17;
  char *pcVar18;
  char *in_R9;
  uint64_t oldstate;
  undefined1 *puVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar25 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  span<const_float> f;
  Float b;
  Float a;
  Float s;
  AssertionResult gtest_ar_;
  Float dp;
  AssertionResult gtest_ar;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  PiecewiseConstant1D distrib;
  AssertHelper local_1b0;
  uint local_1a4;
  float local_1a0;
  float local_19c;
  long *local_198;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  undefined1 local_188 [16];
  undefined8 local_178;
  float local_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  float local_12c;
  undefined1 local_128 [16];
  string local_118;
  undefined1 local_f8 [16];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_e8;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  Float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 *local_98;
  long local_90;
  AssertHelper local_88;
  PiecewiseConstant1D local_80;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_90 = 0;
  local_98 = &DAT_5851f42d4c957f2e;
  do {
    local_c8._8_8_ = 0;
    local_1a0 = *(float *)((long)&DAT_0060eb14 + local_90);
    local_19c = *(float *)((long)&DAT_0060eb10 + local_90);
    local_178 = (undefined1 *)CONCAT44(local_178._4_4_,local_1a0);
    local_1a4 = *(uint *)((long)&DAT_0060eb18 + local_90);
    local_188._0_4_ = local_1a4;
    local_c8._M_unused._M_object = operator_new(0x18);
    *(float **)local_c8._M_unused._0_8_ = &local_19c;
    *(float **)((long)local_c8._M_unused._0_8_ + 8) = &local_1a0;
    *(uint **)((long)local_c8._M_unused._0_8_ + 0x10) = &local_1a4;
    local_b0 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:809:25)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:809:25)>
               ::_M_manager;
    AVar15.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&local_e8,(function<float_(float)> *)&local_c8,0x2000,0x10,(Float)local_178,
               (Float)local_188._0_4_,AVar15);
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    sVar12 = local_e8.nStored;
    pfVar11 = local_e8.ptr;
    local_178 = (undefined1 *)CONCAT44(local_178._4_4_,local_1a0);
    local_188._0_4_ = local_1a4;
    AVar15.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar12;
    f.ptr = pfVar11;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D
              (&local_80,f,(Float)local_178,(Float)local_188._0_4_,AVar15);
    iVar17 = 100;
    puVar19 = local_98;
    do {
      uVar14 = (uint)((ulong)puVar19 >> 0x2d) ^ (uint)((ulong)puVar19 >> 0x1b);
      bVar16 = (byte)((ulong)puVar19 >> 0x3b);
      auVar10._8_8_ = in_XMM6_Qb;
      auVar10._0_8_ = in_XMM6_Qa;
      auVar20 = vcvtusi2ss_avx512f(auVar10,uVar14 >> bVar16 | uVar14 << 0x20 - bVar16);
      auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      local_158 = ZEXT416((uint)local_19c);
      local_128 = ZEXT416((uint)local_1a0);
      local_178 = (undefined1 *)CONCAT44(local_178._4_4_,auVar20._0_4_);
      local_188 = ZEXT416(local_1a4);
      fVar21 = expf(-local_1a0 / local_19c);
      local_148._0_4_ = 1.0 / (fVar21 + 1.0);
      auVar20._8_4_ = 0x80000000;
      auVar20._0_8_ = 0x8000000080000000;
      auVar20._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(local_188,auVar20);
      fVar21 = expf(auVar20._0_4_ / (float)local_158._0_4_);
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)((Float)local_178 * (1.0 / (fVar21 + 1.0)))),
                                ZEXT416((uint)(1.0 - (Float)local_178)),
                                ZEXT416((uint)local_148._0_4_));
      auVar1._8_4_ = 0x80000000;
      auVar1._0_8_ = 0x8000000080000000;
      auVar1._12_4_ = 0x80000000;
      local_158 = vxorps_avx512vl(local_158,auVar1);
      fVar21 = logf(1.0 / auVar20._0_4_ + -1.0);
      auVar20 = vminss_avx(local_188,ZEXT416((uint)(fVar21 * (float)local_158._0_4_)));
      uVar2 = vcmpss_avx512f(ZEXT416((uint)(fVar21 * (float)local_158._0_4_)),local_128,1);
      bVar13 = (bool)((byte)uVar2 & 1);
      local_158._4_12_ = auVar20._4_12_;
      local_158._0_4_ = (uint)bVar13 * local_128._0_4_ + (uint)!bVar13 * auVar20._0_4_;
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar20 = vorps_avx512vl(local_158,auVar3);
      fVar21 = auVar20._0_4_ / local_19c;
      local_188._0_4_ = local_19c;
      local_148 = ZEXT416(local_1a4);
      local_128 = ZEXT416((uint)local_1a0);
      local_f8._0_4_ = fVar21;
      local_15c = expf(fVar21);
      local_f8._0_4_ = expf((float)local_f8._0_4_);
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(local_148,auVar4);
      fVar21 = expf(auVar20._0_4_ / (float)local_188._0_4_);
      local_148._0_4_ = fVar21;
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(local_128,auVar5);
      fVar21 = expf(auVar20._0_4_ / (float)local_188._0_4_);
      local_128._0_4_ = fVar21;
      local_a8 = pbrt::PiecewiseConstant1D::Sample(&local_80,(Float)local_178,&local_12c,(int *)0x0)
      ;
      local_198 = (long *)&DAT_3f689374bc6a7efa;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx512vl(ZEXT416((uint)((float)local_158._0_4_ - local_a8)),auVar6);
      local_1b0.data_._0_4_ = auVar20._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_118,"std::abs(cx - dx)","3e-3",(float *)&local_1b0,
                 (double *)&local_198);
      if ((char)local_118._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_198 + 2),"Closed form = ",0xe);
        std::ostream::_M_insert<double>((double)(float)local_158._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_198 + 2),", distrib = ",0xc);
        std::ostream::_M_insert<double>((double)local_a8);
        pcVar18 = "";
        if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
          pcVar18 = *(char **)local_118._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x333,pcVar18);
        testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        if (local_198 != (long *)0x0) {
          bVar13 = testing::internal::IsTrue(true);
          if ((bVar13) && (local_198 != (long *)0x0)) {
            (**(code **)(*local_198 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_198 = (long *)&DAT_3f689374bc6a7efa;
      fVar21 = (local_15c /
               (((float)local_f8._0_4_ + 1.0) * ((float)local_f8._0_4_ + 1.0) *
               (float)local_188._0_4_)) /
               (1.0 / ((float)local_148._0_4_ + 1.0) + -1.0 / ((float)local_128._0_4_ + 1.0));
      local_188._0_4_ = fVar21;
      auVar7._8_4_ = 0x7fffffff;
      auVar7._0_8_ = 0x7fffffff7fffffff;
      auVar7._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx512vl(ZEXT416((uint)(fVar21 - local_12c)),auVar7);
      local_1b0.data_._0_4_ = auVar20._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_118,"std::abs(cp - dp)","3e-3",(float *)&local_1b0,
                 (double *)&local_198);
      if ((char)local_118._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_198 + 2),"Closed form PDF = ",0x12);
        std::ostream::_M_insert<double>((double)(float)local_188._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_198 + 2),", distrib PDF = ",0x10);
        std::ostream::_M_insert<double>((double)local_12c);
        pcVar18 = "";
        if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
          pcVar18 = *(char **)local_118._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x335,pcVar18);
        testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        if (local_198 != (long *)0x0) {
          bVar13 = testing::internal::IsTrue(true);
          if ((bVar13) && (local_198 != (long *)0x0)) {
            (**(code **)(*local_198 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a8 = -(float)local_158._0_4_;
      uStack_a4 = local_158._4_4_ ^ 0x80000000;
      uStack_a0 = local_158._8_4_ ^ 0x80000000;
      uStack_9c = local_158._12_4_ ^ 0x80000000;
      local_188._0_4_ = local_19c;
      local_148 = ZEXT416((uint)local_1a0);
      local_f8 = ZEXT416(local_1a4);
      local_128._0_4_ = expf(-(float)local_158._0_4_ / local_19c);
      local_128._4_4_ = extraout_XMM0_Db;
      local_128._8_4_ = extraout_XMM0_Dc;
      local_128._12_4_ = extraout_XMM0_Dd;
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(local_148,auVar8);
      local_15c = auVar20._0_4_ / (float)local_188._0_4_;
      local_148._0_4_ = expf(local_15c);
      local_148._4_4_ = extraout_XMM0_Db_00;
      local_148._8_4_ = extraout_XMM0_Dc_00;
      local_148._12_4_ = extraout_XMM0_Dd_00;
      auVar9._8_4_ = 0x80000000;
      auVar9._0_8_ = 0x8000000080000000;
      auVar9._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(local_f8,auVar9);
      local_188._0_4_ = expf(auVar20._0_4_ / (float)local_188._0_4_);
      local_188._4_4_ = extraout_XMM0_Db_01;
      local_188._8_4_ = extraout_XMM0_Dc_01;
      local_188._12_4_ = extraout_XMM0_Dd_01;
      auVar25._0_4_ = expf(local_15c);
      auVar25._4_60_ = extraout_var;
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar20 = vinsertps_avx(local_128,ZEXT416((uint)local_188._0_4_),0x10);
      auVar1 = vinsertps_avx(local_148,auVar25._0_16_,0x10);
      auVar31._8_4_ = 0x7fffffff;
      auVar31._0_8_ = 0x7fffffff7fffffff;
      auVar31._12_4_ = 0x7fffffff;
      auVar27._0_4_ = auVar20._0_4_ + 1.0;
      auVar27._4_4_ = auVar20._4_4_ + 1.0;
      auVar27._8_4_ = auVar20._8_4_ + 1.0;
      auVar27._12_4_ = auVar20._12_4_ + 1.0;
      auVar22._0_4_ = auVar1._0_4_ + 1.0;
      auVar22._4_4_ = auVar1._4_4_ + 1.0;
      auVar22._8_4_ = auVar1._8_4_ + 1.0;
      auVar22._12_4_ = auVar1._12_4_ + 1.0;
      auVar20 = vdivps_avx(auVar29,auVar27);
      auVar1 = vdivps_avx(auVar29,auVar22);
      auVar1 = vsubps_avx(auVar20,auVar1);
      auVar20 = vmovshdup_avx(auVar1);
      auVar23._0_4_ = auVar1._0_4_ / auVar20._0_4_;
      auVar23._4_12_ = auVar1._4_12_;
      auVar20 = vandps_avx(auVar23,auVar31);
      auVar20 = vminss_avx(auVar20,ZEXT416((uint)(Float)local_178));
      fVar21 = (Float)local_178 - auVar23._0_4_;
      bVar13 = auVar20._0_4_ < 0.01;
      auVar20 = vandps_avx(ZEXT416((uint)bVar13 * (int)fVar21 +
                                   (uint)!bVar13 *
                                   (int)((fVar21 + fVar21) / ((Float)local_178 + auVar23._0_4_))),
                           auVar31);
      local_198 = (long *)CONCAT71(local_198._1_7_,auVar20._0_4_ <= 0.01);
      local_190.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (0.01 < auVar20._0_4_) {
        testing::Message::Message((Message *)&local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_1b0.data_._4_4_,local_1b0.data_._0_4_) + 0x10),"u = ",
                   4);
        std::ostream::_M_insert<double>((double)(Float)local_178);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_1b0.data_._4_4_,local_1b0.data_._0_4_) + 0x10),
                   " -> x = ",8);
        std::ostream::_M_insert<double>((double)(float)local_158._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_1b0.data_._4_4_,local_1b0.data_._0_4_) + 0x10),
                   " -> ... ",8);
        local_178 = (undefined1 *)CONCAT44(local_178._4_4_,local_19c);
        local_158 = ZEXT416((uint)local_1a0);
        local_128 = ZEXT416(local_1a4);
        local_188._0_4_ = expf(local_a8 / local_19c);
        local_188._4_4_ = extraout_XMM0_Db_02;
        local_188._8_4_ = extraout_XMM0_Dc_02;
        local_188._12_4_ = extraout_XMM0_Dd_02;
        local_148._0_4_ = -(float)local_158._0_4_ / (Float)local_178;
        local_158._0_4_ = expf(-(float)local_158._0_4_ / (Float)local_178);
        local_158._4_4_ = extraout_XMM0_Db_03;
        local_158._8_4_ = extraout_XMM0_Dc_03;
        local_158._12_4_ = extraout_XMM0_Dd_03;
        fVar21 = expf(-(float)local_128._0_4_ / (Float)local_178);
        local_178 = (undefined1 *)CONCAT44(extraout_XMM0_Db_04,fVar21);
        auVar26._0_4_ = expf((float)local_148._0_4_);
        auVar26._4_60_ = extraout_var_00;
        auVar30._8_4_ = 0x3f800000;
        auVar30._0_8_ = 0x3f8000003f800000;
        auVar30._12_4_ = 0x3f800000;
        auVar20 = vinsertps_avx(local_188,ZEXT416((uint)(Float)local_178),0x10);
        auVar1 = vinsertps_avx(local_158,auVar26._0_16_,0x10);
        auVar28._0_4_ = auVar20._0_4_ + 1.0;
        auVar28._4_4_ = auVar20._4_4_ + 1.0;
        auVar28._8_4_ = auVar20._8_4_ + 1.0;
        auVar28._12_4_ = auVar20._12_4_ + 1.0;
        auVar24._0_4_ = auVar1._0_4_ + 1.0;
        auVar24._4_4_ = auVar1._4_4_ + 1.0;
        auVar24._8_4_ = auVar1._8_4_ + 1.0;
        auVar24._12_4_ = auVar1._12_4_ + 1.0;
        auVar20 = vdivps_avx(auVar30,auVar28);
        auVar1 = vdivps_avx(auVar30,auVar24);
        auVar1 = vsubps_avx(auVar20,auVar1);
        auVar20 = vmovshdup_avx(auVar1);
        std::ostream::_M_insert<double>((double)(auVar1._0_4_ / auVar20._0_4_));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_118,(internal *)&local_198,
                   (AssertionResult *)"checkErr(u, InvertTrimmedLogisticSample(cx, s, a, b))","true"
                   ,"false",in_R9);
        local_178 = puVar19;
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x340,(char *)CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                           (char)local_118._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p) !=
            &local_118.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p
                                  ),local_118.field_2._M_allocated_capacity + 1);
        }
        puVar19 = local_178;
        if (CONCAT44(local_1b0.data_._4_4_,local_1b0.data_._0_4_) != 0) {
          bVar13 = testing::internal::IsTrue(true);
          if ((bVar13) &&
             ((long *)CONCAT44(local_1b0.data_._4_4_,local_1b0.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_1b0.data_._4_4_,local_1b0.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      puVar19 = (undefined1 *)((long)puVar19 * 0x5851f42d4c957f2d + 1);
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    local_80.cdf.nStored = 0;
    (*(local_80.cdf.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_80.cdf.alloc.memoryResource,local_80.cdf.ptr,local_80.cdf.nAlloc << 2,4);
    local_80.func.nStored = 0;
    (*(local_80.func.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_80.func.alloc.memoryResource,local_80.func.ptr,local_80.func.nAlloc << 2,4);
    local_e8.nStored = 0;
    (*(local_e8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_e8.alloc.memoryResource,local_e8.ptr,local_e8.nAlloc << 2,4);
    local_90 = local_90 + 0xc;
  } while (local_90 != 0x24);
  return;
}

Assistant:

TEST(Sampling, Logistic) {
    Float params[][3] = {{1., -Pi, Pi}, {5, 0, 3}, {.25, -5, -3}};
    for (const auto p : params) {
        Float s = p[0], a = p[1], b = p[2];
        auto logistic = [&](Float v) { return TrimmedLogistic(v, s, a, b); };

        auto values = Sample1DFunction(logistic, 8192, 16, a, b);
        PiecewiseConstant1D distrib(values, a, b);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedLogistic(u, s, a, b);
            Float cp = TrimmedLogisticPDF(cx, s, a, b);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 3e-3)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 3e-3)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedLogisticSample(cx, s, a, b)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedLogisticSample(cx, s, a, b);
        }
    }
}